

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O3

bool Imf_3_4::anon_unknown_0::checkCoreFile(exr_context_t f,bool reduceMemory,bool reduceTime)

{
  short sVar1;
  exr_context_t p_Var2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer puVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  byte bVar11;
  int iVar12;
  undefined7 in_register_00000031;
  size_type sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  bool bVar20;
  int32_t curtw;
  int32_t lines_per_chunk;
  exr_storage_t store;
  int32_t curth;
  exr_tile_level_mode_t levelmode;
  vector<unsigned_char,_std::allocator<unsigned_char>_> imgdata;
  int numparts;
  int32_t levh;
  int32_t levw;
  int32_t levelsy;
  int32_t levelsx;
  exr_attr_box2i_t datawin;
  exr_tile_round_mode_t roundingmode;
  uint32_t tysz;
  exr_chunk_info_t cinfo;
  int local_2d8;
  int local_2d4;
  exr_context_t local_2d0;
  int local_2c8;
  uint local_2c4;
  int local_2c0;
  int local_2bc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2b8;
  uint local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  long local_278;
  undefined1 local_270 [4];
  undefined1 local_26c [4];
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  long local_220;
  short local_218;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1b8;
  code *local_130;
  
  iVar3 = exr_get_count(f,&local_29c);
  if (iVar3 == 0) {
    iVar3 = 0;
    if (0 < local_29c) {
      local_2a0 = (uint)CONCAT71(in_register_00000031,reduceMemory) ^ 1;
      local_2d0 = f;
      do {
        iVar4 = exr_get_storage(f,iVar3,&local_2c4);
        if (iVar4 != 0) goto LAB_0011187b;
        if ((local_2c4 & 0xfffffffd) == 1) {
          iVar4 = exr_get_data_window(f,iVar3,&local_288);
          if (((iVar4 != 0) ||
              (iVar4 = exr_get_tile_descriptor(f,iVar3,&local_2c8,local_26c,&local_2bc,local_270),
              iVar4 != 0)) ||
             (iVar4 = exr_get_tile_levels(f,iVar3,&local_28c,&local_290), iVar4 != 0))
          goto LAB_0011187b;
          if (0 < local_290) {
            bVar20 = true;
            local_2d8 = 0;
            iVar19 = 0;
            iVar4 = local_290;
            iVar5 = local_28c;
            do {
              if ((bVar20) && (0 < iVar5)) {
                iVar9 = 0;
                do {
                  iVar4 = exr_get_level_sizes(f,iVar3,iVar9,local_2d8,&local_294,&local_298);
                  if ((iVar4 == 0) &&
                     (iVar4 = exr_get_tile_sizes(f,iVar3,iVar9,local_2d8,&local_2d4,&local_2c0),
                     iVar4 == 0)) {
                    local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    memset(&local_220,0,0x1f0);
                    local_228 = 0x1f8;
                    if ((bool)(0 < local_298 & bVar20)) {
                      lVar10 = 0;
                      iVar5 = 0;
                      bVar11 = 0;
                      iVar4 = local_298;
                      do {
                        if ((bVar20) && (0 < local_294)) {
                          lVar15 = 0;
                          iVar12 = 0;
                          local_278 = lVar10;
                          do {
                            iVar4 = exr_read_tile_chunk_info
                                              (local_2d0,iVar3,iVar12,iVar5,iVar9,local_2d8,
                                               &local_268);
                            if (iVar4 == 0) {
                              if (local_220 == 0) {
                                iVar6 = exr_decoding_initialize(local_2d0,iVar3,&local_268);
                                if (iVar6 == 0) {
                                  if (local_218 < 1) {
                                    sVar13 = 0;
                                  }
                                  else {
                                    lVar10 = 0x28;
                                    lVar17 = 0;
                                    sVar13 = 0;
                                    do {
                                      *(size_type *)(local_220 + lVar10) = sVar13 + 0x1000;
                                      sVar1 = *(short *)(local_220 + -0xc + lVar10);
                                      *(int *)(local_220 + -8 + lVar10) = (int)sVar1;
                                      *(int *)(local_220 + -4 + lVar10) = local_2d4 * sVar1;
                                      sVar13 = (long)local_2c0 * (long)local_2d4 * (long)sVar1 +
                                               sVar13;
                                      lVar17 = lVar17 + 1;
                                      lVar10 = lVar10 + 0x30;
                                    } while (lVar17 < local_218);
                                  }
                                  bVar11 = sVar13 < 1000000 | (byte)local_2a0;
                                  if (local_258._6_1_ == '\x03') {
                                    local_1b8 = &local_2b8;
                                    local_130 = realloc_deepdata;
                                  }
                                  else if (bVar11 != 0) {
                                    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                                    resize(&local_2b8,sVar13);
                                  }
                                  iVar6 = exr_decoding_choose_default_routines
                                                    (local_2d0,iVar3,&local_228);
                                  if (iVar6 == 0) goto LAB_00111ebb;
                                }
LAB_00111f75:
                                bVar20 = false;
                                lVar10 = local_278;
                                iVar4 = local_298;
                                iVar19 = iVar6;
                                break;
                              }
                              iVar6 = exr_decoding_update(local_2d0,iVar3,&local_268,&local_228);
                              if (iVar6 == 0) {
LAB_00111ebb:
                                if ((bVar11 & 1) == 0) {
                                  bVar11 = 0;
                                }
                                else {
                                  if ((local_258._6_1_ != '\x03') && (0 < local_218)) {
                                    lVar10 = 0x28;
                                    lVar17 = 0;
                                    puVar7 = local_2b8.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start;
                                    do {
                                      *(pointer *)(local_220 + lVar10) = puVar7;
                                      sVar1 = *(short *)(local_220 + -0xc + lVar10);
                                      *(int *)(local_220 + -8 + lVar10) = (int)sVar1;
                                      *(int *)(local_220 + -4 + lVar10) = local_2d4 * sVar1;
                                      puVar7 = puVar7 + (long)local_2c0 * (long)local_2d4 *
                                                        (long)sVar1;
                                      lVar17 = lVar17 + 1;
                                      lVar10 = lVar10 + 0x30;
                                    } while (lVar17 < local_218);
                                  }
                                  iVar6 = exr_decoding_run(local_2d0,iVar3,&local_228);
                                  if (iVar6 != 0) {
                                    iVar19 = iVar6;
                                  }
                                  bVar11 = 1;
                                  if (reduceTime && iVar6 != 0) goto LAB_00111f75;
                                }
                              }
                              else {
                                iVar19 = iVar6;
                                if (reduceTime) goto LAB_00111f75;
                              }
                            }
                            else {
                              if (iVar9 == local_2d8) {
                                iVar19 = iVar4;
                              }
                              if (local_2bc == 2) {
                                iVar19 = iVar4;
                              }
                              if (reduceTime) {
                                bVar20 = false;
                                lVar10 = local_278;
                                iVar4 = local_298;
                                break;
                              }
                            }
                            lVar15 = lVar15 + local_2d4;
                            iVar12 = iVar12 + 1;
                            lVar10 = local_278;
                            iVar4 = local_298;
                          } while (lVar15 < local_294);
                        }
                        if (!bVar20) break;
                        lVar10 = lVar10 + local_2c0;
                        iVar5 = iVar5 + 1;
                      } while (lVar10 < iVar4);
                    }
                    f = local_2d0;
                    exr_decoding_destroy(local_2d0,&local_228);
                    if (local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_2b8.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,
                                      (long)local_2b8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_2b8.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  else {
                    if (iVar9 == local_2d8) {
                      iVar19 = iVar4;
                    }
                    if (local_2bc == 2) {
                      iVar19 = iVar4;
                    }
                    if (reduceTime) goto LAB_00112006;
                  }
                  iVar4 = local_290;
                  iVar5 = local_28c;
                } while ((bVar20) && (iVar9 = iVar9 + 1, iVar9 < local_28c));
              }
            } while ((bVar20) && (local_2d8 = local_2d8 + 1, local_2d8 < iVar4));
LAB_00112006:
            bVar20 = iVar19 == 0;
            goto LAB_00112053;
          }
        }
        else if ((local_2c4 & 0xfffffffd) == 0) {
          iVar4 = exr_get_data_window(f,iVar3,&local_288);
          if (iVar4 != 0) goto LAB_0011187b;
          lVar10 = (long)local_280;
          lVar17 = (long)local_288;
          lVar18 = (long)local_27c;
          lVar15 = (long)local_284;
          local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          memset(&local_220,0,0x1f0);
          local_228 = 0x1f8;
          iVar4 = exr_get_scanlines_per_chunk(f,iVar3,&local_2c8);
          bVar20 = true;
          if (iVar4 == 0) {
            iVar4 = 0;
            if (lVar18 + 1 != lVar15) {
              lVar10 = (lVar10 - lVar17) + 1;
              iVar4 = 0;
              uVar16 = 0;
              bVar11 = 0;
              do {
                p_Var2 = local_2d0;
                local_238 = 0;
                uStack_230 = 0;
                local_248 = 0;
                uStack_240 = 0;
                local_258 = 0;
                uStack_250 = 0;
                local_268 = 0;
                uStack_260 = 0;
                iVar5 = exr_read_scanline_chunk_info
                                  (local_2d0,iVar3,local_284 + (int)uVar16,&local_268);
                if (iVar5 == 0) {
                  if (local_220 == 0) {
                    iVar5 = exr_decoding_initialize(p_Var2,iVar3,&local_268);
                    if (iVar5 != 0) break;
                    if (local_218 < 1) {
                      sVar13 = 0;
                    }
                    else {
                      lVar17 = 0x28;
                      lVar8 = 0;
                      sVar13 = 0;
                      do {
                        *(undefined8 *)(local_220 + lVar17) = 0x1000;
                        sVar1 = *(short *)(local_220 + -0xc + lVar17);
                        *(int *)(local_220 + -8 + lVar17) = (int)sVar1;
                        lVar14 = sVar1 * lVar10;
                        *(int *)(local_220 + -4 + lVar17) = (int)lVar14;
                        sVar13 = sVar13 + local_2c8 * lVar14;
                        lVar8 = lVar8 + 1;
                        lVar17 = lVar17 + 0x30;
                      } while (lVar8 < local_218);
                    }
                    bVar11 = sVar13 < 8000000 | (byte)local_2a0;
                    if (local_258._6_1_ == '\x02') {
                      local_1b8 = &local_2b8;
                      local_130 = realloc_deepdata;
                    }
                    else if (bVar11 != 0) {
                      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                                (&local_2b8,sVar13);
                    }
                    iVar5 = exr_decoding_choose_default_routines(p_Var2,iVar3,&local_228);
                    if (iVar5 != 0) {
                      iVar4 = 1;
                      break;
                    }
                  }
                  else {
                    iVar5 = exr_decoding_update(p_Var2,iVar3,&local_268,&local_228);
                    if (iVar5 != 0) goto LAB_001119c3;
                  }
                  iVar5 = iVar4;
                  if ((bVar11 & 1) == 0) {
                    bVar11 = 0;
                  }
                  else {
                    if ((local_258._6_1_ != '\x02') && (0 < local_218)) {
                      lVar17 = 0x28;
                      lVar8 = 0;
                      puVar7 = local_2b8.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      do {
                        *(pointer *)(local_220 + lVar17) = puVar7;
                        sVar1 = *(short *)(local_220 + -0xc + lVar17);
                        *(int *)(local_220 + -8 + lVar17) = (int)sVar1;
                        lVar14 = sVar1 * lVar10;
                        *(int *)(local_220 + -4 + lVar17) = (int)lVar14;
                        puVar7 = puVar7 + local_2c8 * lVar14;
                        lVar8 = lVar8 + 1;
                        lVar17 = lVar17 + 0x30;
                      } while (lVar8 < local_218);
                    }
                    iVar4 = exr_decoding_run(p_Var2,iVar3,&local_228);
                    if (iVar4 != 0) {
                      iVar5 = iVar4;
                    }
                    bVar11 = 1;
                    if (iVar4 != 0 && reduceTime) break;
                  }
                }
                else {
LAB_001119c3:
                  iVar4 = iVar5;
                  if (reduceTime) break;
                }
                iVar4 = iVar5;
                uVar16 = uVar16 + (long)local_2c8;
              } while (uVar16 < (ulong)((lVar18 + 1) - lVar15));
            }
            exr_decoding_destroy(local_2d0,&local_228);
            bVar20 = iVar4 != 0;
          }
          if (local_2b8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_2b8.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_2b8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_2b8.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          bVar20 = !bVar20;
          f = local_2d0;
LAB_00112053:
          if (!bVar20) goto LAB_0011187b;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < local_29c);
    }
    bVar20 = false;
  }
  else {
LAB_0011187b:
    bVar20 = true;
  }
  return bVar20;
}

Assistant:

bool
checkCoreFile (exr_context_t f, bool reduceMemory, bool reduceTime)
{
    exr_result_t rv;
    int          numparts;

    rv = exr_get_count (f, &numparts);
    if (rv != EXR_ERR_SUCCESS) return true;

    for (int p = 0; p < numparts; ++p)
    {
        exr_storage_t store;
        rv = exr_get_storage (f, p, &store);
        if (rv != EXR_ERR_SUCCESS) return true;

        if (store == EXR_STORAGE_SCANLINE || store == EXR_STORAGE_DEEP_SCANLINE)
        {
            if (readCoreScanlinePart (f, p, reduceMemory, reduceTime))
                return true;
        }
        else if (store == EXR_STORAGE_TILED || store == EXR_STORAGE_DEEP_TILED)
        {
            if (readCoreTiledPart (f, p, reduceMemory, reduceTime)) return true;
        }
    }

    return false;
}